

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

void __thiscall
kj::_::Delimited<kj::ArrayPtr<void_*const>_>::ensureStringifiedInitialized
          (Delimited<kj::ArrayPtr<void_*const>_> *this)

{
  CappedArray<char,_17UL> *pCVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  anon_class_1_0_00000001 local_29;
  Array<kj::CappedArray<char,_17UL>_> local_28;
  Mapper<kj::ArrayPtr<void_*const>_&> local_10;
  
  if (((this->array).size_ != 0) && ((this->stringified).size_ == 0)) {
    local_10.array = &this->array;
    Mapper<kj::ArrayPtr<void_*const>_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_string_h:886:21)>
              (&local_28,&local_10,&local_29);
    pCVar1 = (this->stringified).ptr;
    if (pCVar1 != (CappedArray<char,_17UL> *)0x0) {
      sVar2 = (this->stringified).size_;
      (this->stringified).ptr = (CappedArray<char,_17UL> *)0x0;
      (this->stringified).size_ = 0;
      pAVar3 = (this->stringified).disposer;
      (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pCVar1,0x20,sVar2,sVar2,0);
    }
    (this->stringified).ptr = local_28.ptr;
    (this->stringified).size_ = local_28.size_;
    (this->stringified).disposer = local_28.disposer;
  }
  return;
}

Assistant:

void ensureStringifiedInitialized() {
    if (array.size() > 0 && stringified.size() == 0) {
      stringified = KJ_MAP(e, array) { return toCharSequence(e); };
    }
  }